

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.hpp
# Opt level: O0

void Qentem::Memory::Copy<unsigned_int>(void *to,void *from,uint size)

{
  VAR_T *left;
  char *src;
  char *des;
  VAR_T *local_40;
  VAR_T *end;
  VAR_T *m_form;
  VAR_T *m_to;
  uint local_20;
  uint m_size;
  uint offset;
  uint size_local;
  void *from_local;
  void *to_local;
  
  local_20 = 0;
  m_to._4_4_ = size >> 4;
  from_local = to;
  _offset = from;
  m_size = size;
  if (m_to._4_4_ != 0) {
    local_20 = m_to._4_4_ << 4;
    local_40 = (VAR_T *)((long)from + (ulong)m_to._4_4_ * 0x10);
    end = (VAR_T *)from;
    m_form = (VAR_T *)to;
    do {
      left = m_form;
      Platform::SIMD::Load(end);
      Platform::SIMD::Store(left,(VAR_T *)&des);
      end = end + 1;
      m_form = m_form + 1;
    } while (end < local_40);
  }
  for (; local_20 < m_size; local_20 = local_20 + 1) {
    *(undefined1 *)((long)from_local + (ulong)local_20) =
         *(undefined1 *)((long)_offset + (ulong)local_20);
  }
  return;
}

Assistant:

QENTEM_NOINLINE static void Copy(void *to, const void *from, Number_T size) noexcept {
    Number_T offset = 0;

    if (Config::IsSIMDEnabled) {
        const Number_T m_size = (size >> Platform::SIMD::Shift);

        if (m_size != 0) {
            offset = m_size;
            offset <<= Platform::SIMD::Shift;

            Platform::SIMD::VAR_T       *m_to   = (Platform::SIMD::VAR_T *)(to);
            const Platform::SIMD::VAR_T *m_form = (const Platform::SIMD::VAR_T *)(from);
            const Platform::SIMD::VAR_T *end    = (m_form + m_size);

            do {
                Platform::SIMD::Store(m_to, Platform::SIMD::Load(m_form));
                ++m_form;
                ++m_to;
            } while (m_form < end);
        }
    }

    char       *des = (char *)(to);
    const char *src = (const char *)(from);

    while (offset < size) {
        des[offset] = src[offset];
        ++offset;
    }
}